

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

void ncnn::transpose_pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  long lVar22;
  undefined1 (*pauVar24) [64];
  undefined1 (*pauVar25) [32];
  undefined1 (*pauVar26) [16];
  long lVar27;
  long lVar28;
  undefined1 (*pauVar29) [64];
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  undefined4 *puVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  bool bVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  size_t *psVar23;
  
  psVar23 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar23 = &B->cstep;
  }
  iVar1 = (int)*psVar23;
  lVar22 = (long)iVar1;
  lVar33 = (long)(k * iVar1);
  uVar31 = 0;
  iVar35 = 0;
  if (0 < max_kk) {
    iVar35 = max_kk;
  }
  lVar36 = (long)j;
  lVar30 = lVar33 * 4;
  lVar27 = lVar30 + lVar36 * 4;
  local_a0 = lVar30 + 4 + lVar36 * 4;
  local_58 = lVar30 + 0x10 + lVar36 * 4;
  local_98 = lVar30 + 0x20 + lVar36 * 4;
  lVar28 = lVar36 * 0x40;
  lVar39 = lVar36 * 0x20;
  lVar36 = lVar36 * 0x10;
  lVar30 = lVar28 + lVar33 * 4;
  local_a8 = lVar28 + lVar33 * 4 + 0x40;
  local_78 = lVar28 + 0xc0 + lVar33 * 4;
  local_60 = lVar28 + 0x1c0 + lVar33 * 4;
  local_c0 = lVar28 + 0x2c0 + lVar33 * 4;
  lVar28 = lVar39 + lVar33 * 4;
  local_b0 = lVar39 + 0x20 + lVar33 * 4;
  local_80 = lVar39 + 0x60 + lVar33 * 4;
  local_68 = lVar39 + 0xe0 + lVar33 * 4;
  local_48 = lVar39 + 0x160 + lVar33 * 4;
  lVar39 = lVar36 + lVar33 * 4;
  local_b8 = lVar36 + 0x10 + lVar33 * 4;
  local_88 = lVar36 + 0x30 + lVar33 * 4;
  local_70 = lVar36 + 0x70 + lVar33 * 4;
  local_50 = lVar36 + 0xb0 + lVar33 * 4;
  pauVar29 = (undefined1 (*) [64])BT->data;
  lVar36 = (long)max_jj;
  lVar40 = (long)(iVar1 << 4) * 4;
  lVar37 = (long)(iVar1 * 8) * 4;
  lVar38 = (long)(iVar1 * 4) * 4;
  lVar33 = lVar22 * 4;
  iVar1 = B->elempack;
  for (; (long)uVar31 < lVar36 + -0xb; uVar31 = uVar31 + 0xc) {
    if (iVar1 == 0x10) {
      pauVar24 = (undefined1 (*) [64])((long)B->data + local_c0);
      for (iVar32 = 0xf; iVar32 < max_kk; iVar32 = iVar32 + 0x10) {
        auVar44 = vunpcklps_avx512f(pauVar24[-0xb],pauVar24[-10]);
        auVar45 = vunpckhps_avx512f(pauVar24[-0xb],pauVar24[-10]);
        auVar46 = vunpcklps_avx512f(pauVar24[-9],pauVar24[-8]);
        auVar47 = vunpckhps_avx512f(pauVar24[-9],pauVar24[-8]);
        auVar48 = vunpcklps_avx512f(pauVar24[-7],pauVar24[-6]);
        auVar49 = vunpckhps_avx512f(pauVar24[-7],pauVar24[-6]);
        auVar50 = vunpcklps_avx512f(pauVar24[-5],pauVar24[-4]);
        auVar51 = vunpckhps_avx512f(pauVar24[-5],pauVar24[-4]);
        auVar52 = vunpcklps_avx512f(pauVar24[-3],pauVar24[-2]);
        auVar53 = vunpckhps_avx512f(pauVar24[-3],pauVar24[-2]);
        auVar54 = vunpcklps_avx512f(pauVar24[-1],*pauVar24);
        auVar55 = vunpckhps_avx512f(pauVar24[-1],*pauVar24);
        auVar56 = vunpcklpd_avx512f(auVar44,auVar46);
        auVar44 = vunpckhpd_avx512f(auVar44,auVar46);
        auVar46 = vunpcklpd_avx512f(auVar45,auVar47);
        auVar45 = vunpckhpd_avx512f(auVar45,auVar47);
        auVar47 = vunpcklpd_avx512f(auVar48,auVar50);
        auVar48 = vunpckhpd_avx512f(auVar48,auVar50);
        auVar50 = vunpcklpd_avx512f(auVar49,auVar51);
        auVar49 = vunpckhpd_avx512f(auVar49,auVar51);
        auVar51 = vunpcklpd_avx512f(auVar52,auVar54);
        auVar52 = vunpckhpd_avx512f(auVar52,auVar54);
        auVar54 = vunpcklpd_avx512f(auVar53,auVar55);
        auVar53 = vunpckhpd_avx512f(auVar53,auVar55);
        auVar55 = vshuff64x2_avx512f(auVar56,auVar47,0x88);
        auVar57 = vshuff64x2_avx512f(auVar51,auVar44,0x88);
        auVar58 = vshuff64x2_avx512f(auVar48,auVar52,0x88);
        auVar59 = vshuff64x2_avx512f(auVar46,auVar50,0x88);
        auVar60 = vshuff64x2_avx512f(auVar54,auVar45,0x88);
        auVar61 = vshuff64x2_avx512f(auVar49,auVar53,0x88);
        auVar47 = vshuff64x2_avx512f(auVar56,auVar47,0xdd);
        auVar44 = vshuff64x2_avx512f(auVar51,auVar44,0xdd);
        auVar48 = vshuff64x2_avx512f(auVar48,auVar52,0xdd);
        auVar46 = vshuff64x2_avx512f(auVar46,auVar50,0xdd);
        auVar45 = vshuff64x2_avx512f(auVar54,auVar45,0xdd);
        auVar49 = vshuff64x2_avx512f(auVar49,auVar53,0xdd);
        auVar50 = vshuff64x2_avx512f(auVar55,auVar57,0x88);
        auVar51 = vshuff64x2_avx512f(auVar58,auVar59,0x88);
        auVar52 = vshuff64x2_avx512f(auVar60,auVar61,0x88);
        auVar53 = vshuff64x2_avx512f(auVar47,auVar44,0x88);
        auVar54 = vshuff64x2_avx512f(auVar48,auVar46,0x88);
        auVar56 = vshuff64x2_avx512f(auVar45,auVar49,0x88);
        auVar55 = vshuff64x2_avx512f(auVar55,auVar57,0xdd);
        auVar57 = vshuff64x2_avx512f(auVar58,auVar59,0xdd);
        auVar58 = vshuff64x2_avx512f(auVar60,auVar61,0xdd);
        auVar44 = vshuff64x2_avx512f(auVar47,auVar44,0xdd);
        auVar46 = vshuff64x2_avx512f(auVar48,auVar46,0xdd);
        auVar45 = vshuff64x2_avx512f(auVar45,auVar49,0xdd);
        *pauVar29 = auVar50;
        pauVar29[1] = auVar51;
        pauVar29[2] = auVar52;
        pauVar29[3] = auVar53;
        pauVar29[4] = auVar54;
        pauVar29[5] = auVar56;
        pauVar29[6] = auVar55;
        pauVar29[7] = auVar57;
        pauVar29[8] = auVar58;
        pauVar29[9] = auVar44;
        pauVar29[10] = auVar46;
        pauVar29[0xb] = auVar45;
        pauVar29 = pauVar29 + 0xc;
        pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar40);
      }
    }
    if (iVar1 == 8) {
      pauVar25 = (undefined1 (*) [32])((long)B->data + local_48);
      for (iVar32 = 7; iVar32 < max_kk; iVar32 = iVar32 + 8) {
        auVar19 = vunpcklps_avx(pauVar25[-0xb],pauVar25[-10]);
        auVar6 = vunpckhps_avx(pauVar25[-0xb],pauVar25[-10]);
        auVar20 = vunpcklps_avx(pauVar25[-9],pauVar25[-8]);
        auVar63 = vunpckhps_avx(pauVar25[-9],pauVar25[-8]);
        auVar66 = vunpcklps_avx(pauVar25[-7],pauVar25[-6]);
        auVar62 = vunpckhps_avx(pauVar25[-7],pauVar25[-6]);
        auVar68 = vunpcklps_avx(pauVar25[-5],pauVar25[-4]);
        auVar7 = vunpckhps_avx(pauVar25[-5],pauVar25[-4]);
        auVar69 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
        auVar64 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
        auVar42 = vunpcklps_avx(pauVar25[-1],*pauVar25);
        auVar8 = vunpckhps_avx(pauVar25[-1],*pauVar25);
        auVar14 = vunpcklpd_avx(auVar19,auVar20);
        auVar19 = vunpckhpd_avx(auVar19,auVar20);
        auVar20 = vunpcklpd_avx(auVar6,auVar63);
        auVar6 = vunpckhpd_avx(auVar6,auVar63);
        auVar65 = vunpcklpd_avx(auVar66,auVar68);
        auVar63 = vunpckhpd_avx(auVar66,auVar68);
        auVar66 = vunpcklpd_avx(auVar62,auVar7);
        auVar62 = vunpckhpd_avx(auVar62,auVar7);
        auVar68 = vunpcklpd_avx(auVar69,auVar42);
        auVar7 = vunpckhpd_avx(auVar69,auVar42);
        auVar69 = vunpcklpd_avx(auVar64,auVar8);
        auVar64 = vunpckhpd_avx(auVar64,auVar8);
        auVar67._16_16_ = auVar65._0_16_;
        auVar67._0_16_ = auVar14._0_16_;
        auVar70._16_16_ = auVar19._0_16_;
        auVar70._0_16_ = auVar68._0_16_;
        auVar71._16_16_ = auVar7._0_16_;
        auVar71._0_16_ = auVar63._0_16_;
        auVar72._16_16_ = auVar66._0_16_;
        auVar72._0_16_ = auVar20._0_16_;
        auVar42 = vinsertf32x4_avx512vl(auVar69,auVar6._0_16_,1);
        auVar43 = vinsertf32x4_avx512vl(auVar62,auVar64._0_16_,1);
        auVar8 = vperm2f128_avx(auVar14,auVar65,0x31);
        auVar19 = vperm2f128_avx(auVar68,auVar19,0x31);
        auVar63 = vperm2f128_avx(auVar63,auVar7,0x31);
        auVar7 = vperm2f128_avx(auVar20,auVar66,0x31);
        auVar6 = vperm2f128_avx(auVar69,auVar6,0x31);
        auVar62 = vperm2f128_avx(auVar62,auVar64,0x31);
        *(undefined1 (*) [32])*pauVar29 = auVar67;
        *(undefined1 (*) [32])(*pauVar29 + 0x20) = auVar70;
        *(undefined1 (*) [32])pauVar29[1] = auVar71;
        *(undefined1 (*) [32])(pauVar29[1] + 0x20) = auVar72;
        *(undefined1 (*) [32])pauVar29[2] = auVar42;
        *(undefined1 (*) [32])(pauVar29[2] + 0x20) = auVar43;
        *(undefined1 (*) [32])pauVar29[3] = auVar8;
        *(undefined1 (*) [32])(pauVar29[3] + 0x20) = auVar19;
        *(undefined1 (*) [32])pauVar29[4] = auVar63;
        *(undefined1 (*) [32])(pauVar29[4] + 0x20) = auVar7;
        *(undefined1 (*) [32])pauVar29[5] = auVar6;
        *(undefined1 (*) [32])(pauVar29[5] + 0x20) = auVar62;
        pauVar29 = pauVar29 + 6;
        pauVar25 = (undefined1 (*) [32])(*pauVar25 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar26 = (undefined1 (*) [16])((long)B->data + local_50);
      for (iVar32 = 3; iVar32 < max_kk; iVar32 = iVar32 + 4) {
        auVar15 = vunpcklps_avx(pauVar26[-0xb],pauVar26[-10]);
        auVar16 = vunpcklps_avx(pauVar26[-9],pauVar26[-8]);
        auVar2 = vunpckhps_avx(pauVar26[-0xb],pauVar26[-10]);
        auVar3 = vunpckhps_avx(pauVar26[-9],pauVar26[-8]);
        auVar9 = vunpcklpd_avx(auVar15,auVar16);
        auVar15 = vunpckhpd_avx(auVar15,auVar16);
        auVar10 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(pauVar26[-7],pauVar26[-6]);
        auVar17 = vunpcklps_avx(pauVar26[-5],pauVar26[-4]);
        auVar16 = vunpckhps_avx(pauVar26[-7],pauVar26[-6]);
        auVar4 = vunpckhps_avx(pauVar26[-5],pauVar26[-4]);
        auVar11 = vunpcklpd_avx(auVar3,auVar17);
        auVar3 = vunpckhpd_avx(auVar3,auVar17);
        auVar12 = vunpcklpd_avx(auVar16,auVar4);
        auVar16 = vunpckhpd_avx(auVar16,auVar4);
        auVar4 = vunpcklps_avx(pauVar26[-3],pauVar26[-2]);
        auVar18 = vunpcklps_avx(pauVar26[-1],*pauVar26);
        auVar17 = vunpckhps_avx(pauVar26[-3],pauVar26[-2]);
        auVar5 = vunpckhps_avx(pauVar26[-1],*pauVar26);
        auVar13 = vunpcklpd_avx(auVar4,auVar18);
        auVar4 = vunpckhpd_avx(auVar4,auVar18);
        auVar18 = vunpcklpd_avx(auVar17,auVar5);
        auVar17 = vunpckhpd_avx(auVar17,auVar5);
        *(undefined1 (*) [16])*pauVar29 = auVar9;
        *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar11;
        *(undefined1 (*) [16])(*pauVar29 + 0x20) = auVar13;
        *(undefined1 (*) [16])(*pauVar29 + 0x30) = auVar15;
        *(undefined1 (*) [16])pauVar29[1] = auVar3;
        *(undefined1 (*) [16])(pauVar29[1] + 0x10) = auVar4;
        *(undefined1 (*) [16])(pauVar29[1] + 0x20) = auVar10;
        *(undefined1 (*) [16])(pauVar29[1] + 0x30) = auVar12;
        *(undefined1 (*) [16])pauVar29[2] = auVar18;
        *(undefined1 (*) [16])(pauVar29[2] + 0x10) = auVar2;
        *(undefined1 (*) [16])(pauVar29[2] + 0x20) = auVar16;
        *(undefined1 (*) [16])(pauVar29[2] + 0x30) = auVar17;
        pauVar29 = pauVar29 + 3;
        pauVar26 = (undefined1 (*) [16])(*pauVar26 + lVar38);
      }
    }
    if (iVar1 == 1) {
      pauVar26 = (undefined1 (*) [16])((long)B->data + local_98);
      iVar32 = iVar35;
      while (bVar41 = iVar32 != 0, iVar32 = iVar32 + -1, bVar41) {
        uVar21 = *(undefined8 *)(pauVar26[-2] + 8);
        *(undefined8 *)*pauVar29 = *(undefined8 *)pauVar26[-2];
        *(undefined8 *)(*pauVar29 + 8) = uVar21;
        uVar21 = *(undefined8 *)(pauVar26[-1] + 8);
        *(undefined8 *)(*pauVar29 + 0x10) = *(undefined8 *)pauVar26[-1];
        *(undefined8 *)(*pauVar29 + 0x18) = uVar21;
        *(undefined1 (*) [16])(*pauVar29 + 0x20) = *pauVar26;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x30);
        pauVar26 = (undefined1 (*) [16])(*pauVar26 + lVar33);
      }
    }
    lVar30 = lVar30 + 0x300;
    lVar28 = lVar28 + 0x180;
    lVar39 = lVar39 + 0xc0;
    lVar27 = lVar27 + 0x30;
    local_a8 = local_a8 + 0x300;
    local_b0 = local_b0 + 0x180;
    local_b8 = local_b8 + 0xc0;
    local_a0 = local_a0 + 0x30;
    local_78 = local_78 + 0x300;
    local_80 = local_80 + 0x180;
    local_88 = local_88 + 0xc0;
    local_60 = local_60 + 0x300;
    local_68 = local_68 + 0x180;
    local_70 = local_70 + 0xc0;
    local_58 = local_58 + 0x30;
    local_c0 = local_c0 + 0x300;
    local_48 = local_48 + 0x180;
    local_50 = local_50 + 0xc0;
    local_98 = local_98 + 0x30;
  }
  local_c0 = lVar28;
  for (; (long)uVar31 < lVar36 + -7; uVar31 = uVar31 + 8) {
    if (iVar1 == 0x10) {
      pauVar24 = (undefined1 (*) [64])((long)B->data + local_60);
      for (iVar32 = 0xf; iVar32 < max_kk; iVar32 = iVar32 + 0x10) {
        auVar44 = vunpcklps_avx512f(pauVar24[-7],pauVar24[-6]);
        auVar45 = vunpckhps_avx512f(pauVar24[-7],pauVar24[-6]);
        auVar46 = vunpcklps_avx512f(pauVar24[-5],pauVar24[-4]);
        auVar47 = vunpckhps_avx512f(pauVar24[-5],pauVar24[-4]);
        auVar48 = vunpcklps_avx512f(pauVar24[-3],pauVar24[-2]);
        auVar49 = vunpckhps_avx512f(pauVar24[-3],pauVar24[-2]);
        auVar50 = vunpcklps_avx512f(pauVar24[-1],*pauVar24);
        auVar51 = vunpckhps_avx512f(pauVar24[-1],*pauVar24);
        auVar52 = vunpcklpd_avx512f(auVar44,auVar46);
        auVar44 = vunpckhpd_avx512f(auVar44,auVar46);
        auVar46 = vunpcklpd_avx512f(auVar45,auVar47);
        auVar45 = vunpckhpd_avx512f(auVar45,auVar47);
        auVar47 = vunpcklpd_avx512f(auVar48,auVar50);
        auVar48 = vunpckhpd_avx512f(auVar48,auVar50);
        auVar50 = vunpcklpd_avx512f(auVar49,auVar51);
        auVar49 = vunpckhpd_avx512f(auVar49,auVar51);
        auVar51 = vshuff64x2_avx512f(auVar52,auVar47,0x88);
        auVar53 = vshuff64x2_avx512f(auVar44,auVar48,0x88);
        auVar54 = vshuff64x2_avx512f(auVar46,auVar50,0x88);
        auVar55 = vshuff64x2_avx512f(auVar45,auVar49,0x88);
        auVar47 = vshuff64x2_avx512f(auVar52,auVar47,0xdd);
        auVar44 = vshuff64x2_avx512f(auVar44,auVar48,0xdd);
        auVar46 = vshuff64x2_avx512f(auVar46,auVar50,0xdd);
        auVar45 = vshuff64x2_avx512f(auVar45,auVar49,0xdd);
        auVar48 = vshuff64x2_avx512f(auVar51,auVar53,0x88);
        auVar49 = vshuff64x2_avx512f(auVar54,auVar55,0x88);
        auVar50 = vshuff64x2_avx512f(auVar47,auVar44,0x88);
        auVar52 = vshuff64x2_avx512f(auVar46,auVar45,0x88);
        auVar51 = vshuff64x2_avx512f(auVar51,auVar53,0xdd);
        auVar53 = vshuff64x2_avx512f(auVar54,auVar55,0xdd);
        auVar44 = vshuff64x2_avx512f(auVar47,auVar44,0xdd);
        auVar45 = vshuff64x2_avx512f(auVar46,auVar45,0xdd);
        *pauVar29 = auVar48;
        pauVar29[1] = auVar49;
        pauVar29[2] = auVar50;
        pauVar29[3] = auVar52;
        pauVar29[4] = auVar51;
        pauVar29[5] = auVar53;
        pauVar29[6] = auVar44;
        pauVar29[7] = auVar45;
        pauVar29 = pauVar29 + 8;
        pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar40);
      }
    }
    if (iVar1 == 8) {
      pauVar25 = (undefined1 (*) [32])((long)B->data + local_68);
      for (iVar32 = 7; iVar32 < max_kk; iVar32 = iVar32 + 8) {
        auVar19 = vunpcklps_avx(pauVar25[-7],pauVar25[-6]);
        auVar6 = vunpckhps_avx(pauVar25[-7],pauVar25[-6]);
        auVar8 = vunpcklps_avx(pauVar25[-5],pauVar25[-4]);
        auVar63 = vunpckhps_avx(pauVar25[-5],pauVar25[-4]);
        auVar20 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
        auVar62 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
        auVar65 = vunpcklps_avx(pauVar25[-1],*pauVar25);
        auVar7 = vunpckhps_avx(pauVar25[-1],*pauVar25);
        auVar64 = vunpcklpd_avx(auVar19,auVar8);
        auVar19 = vunpckhpd_avx(auVar19,auVar8);
        auVar8 = vunpcklpd_avx(auVar6,auVar63);
        auVar6 = vunpckhpd_avx(auVar6,auVar63);
        auVar14 = vunpcklpd_avx(auVar20,auVar65);
        auVar63 = vunpckhpd_avx(auVar20,auVar65);
        auVar20 = vunpcklpd_avx(auVar62,auVar7);
        auVar62 = vunpckhpd_avx(auVar62,auVar7);
        auVar65._16_16_ = auVar14._0_16_;
        auVar65._0_16_ = auVar64._0_16_;
        auVar66._16_16_ = auVar63._0_16_;
        auVar66._0_16_ = auVar19._0_16_;
        auVar68._16_16_ = auVar20._0_16_;
        auVar68._0_16_ = auVar8._0_16_;
        auVar69._16_16_ = auVar62._0_16_;
        auVar69._0_16_ = auVar6._0_16_;
        auVar7 = vperm2f128_avx(auVar64,auVar14,0x31);
        auVar19 = vperm2f128_avx(auVar19,auVar63,0x31);
        auVar63 = vperm2f128_avx(auVar8,auVar20,0x31);
        auVar6 = vperm2f128_avx(auVar6,auVar62,0x31);
        *(undefined1 (*) [32])*pauVar29 = auVar65;
        *(undefined1 (*) [32])(*pauVar29 + 0x20) = auVar66;
        *(undefined1 (*) [32])pauVar29[1] = auVar68;
        *(undefined1 (*) [32])(pauVar29[1] + 0x20) = auVar69;
        *(undefined1 (*) [32])pauVar29[2] = auVar7;
        *(undefined1 (*) [32])(pauVar29[2] + 0x20) = auVar19;
        *(undefined1 (*) [32])pauVar29[3] = auVar63;
        *(undefined1 (*) [32])(pauVar29[3] + 0x20) = auVar6;
        pauVar29 = pauVar29 + 4;
        pauVar25 = (undefined1 (*) [32])(*pauVar25 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar26 = (undefined1 (*) [16])((long)B->data + local_70);
      for (iVar32 = 3; iVar32 < max_kk; iVar32 = iVar32 + 4) {
        auVar15 = vunpcklps_avx(pauVar26[-7],pauVar26[-6]);
        auVar16 = vunpcklps_avx(pauVar26[-5],pauVar26[-4]);
        auVar2 = vunpckhps_avx(pauVar26[-7],pauVar26[-6]);
        auVar3 = vunpckhps_avx(pauVar26[-5],pauVar26[-4]);
        auVar17 = vunpcklpd_avx(auVar15,auVar16);
        auVar15 = vunpckhpd_avx(auVar15,auVar16);
        auVar5 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        auVar3 = vunpcklps_avx(pauVar26[-3],pauVar26[-2]);
        auVar10 = vunpcklps_avx(pauVar26[-1],*pauVar26);
        auVar16 = vunpckhps_avx(pauVar26[-3],pauVar26[-2]);
        auVar4 = vunpckhps_avx(pauVar26[-1],*pauVar26);
        auVar9 = vunpcklpd_avx(auVar3,auVar10);
        auVar3 = vunpckhpd_avx(auVar3,auVar10);
        auVar10 = vunpcklpd_avx(auVar16,auVar4);
        auVar16 = vunpckhpd_avx(auVar16,auVar4);
        *(undefined1 (*) [16])*pauVar29 = auVar17;
        *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar9;
        *(undefined1 (*) [16])(*pauVar29 + 0x20) = auVar15;
        *(undefined1 (*) [16])(*pauVar29 + 0x30) = auVar3;
        *(undefined1 (*) [16])pauVar29[1] = auVar5;
        *(undefined1 (*) [16])(pauVar29[1] + 0x10) = auVar10;
        *(undefined1 (*) [16])(pauVar29[1] + 0x20) = auVar2;
        *(undefined1 (*) [16])(pauVar29[1] + 0x30) = auVar16;
        pauVar29 = pauVar29 + 2;
        pauVar26 = (undefined1 (*) [16])(*pauVar26 + lVar38);
      }
    }
    if (iVar1 == 1) {
      pauVar26 = (undefined1 (*) [16])((long)B->data + local_58);
      iVar32 = iVar35;
      while (bVar41 = iVar32 != 0, iVar32 = iVar32 + -1, bVar41) {
        uVar21 = *(undefined8 *)(pauVar26[-1] + 8);
        *(undefined8 *)*pauVar29 = *(undefined8 *)pauVar26[-1];
        *(undefined8 *)(*pauVar29 + 8) = uVar21;
        *(undefined1 (*) [16])(*pauVar29 + 0x10) = *pauVar26;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
        pauVar26 = (undefined1 (*) [16])(*pauVar26 + lVar33);
      }
    }
    lVar30 = lVar30 + 0x200;
    local_c0 = local_c0 + 0x100;
    lVar39 = lVar39 + 0x80;
    lVar27 = lVar27 + 0x20;
    local_a8 = local_a8 + 0x200;
    local_b0 = local_b0 + 0x100;
    local_b8 = local_b8 + 0x80;
    local_a0 = local_a0 + 0x20;
    local_78 = local_78 + 0x200;
    local_80 = local_80 + 0x100;
    local_88 = local_88 + 0x80;
    local_60 = local_60 + 0x200;
    local_68 = local_68 + 0x100;
    local_70 = local_70 + 0x80;
    local_58 = local_58 + 0x20;
  }
  for (; (long)(uVar31 | 3) < lVar36; uVar31 = uVar31 + 4) {
    if (iVar1 == 0x10) {
      pauVar24 = (undefined1 (*) [64])((long)B->data + local_78);
      for (iVar32 = 0xf; iVar32 < max_kk; iVar32 = iVar32 + 0x10) {
        auVar44 = vunpcklps_avx512f(pauVar24[-3],pauVar24[-2]);
        auVar45 = vunpckhps_avx512f(pauVar24[-3],pauVar24[-2]);
        auVar46 = vunpcklps_avx512f(pauVar24[-1],*pauVar24);
        auVar47 = vunpckhps_avx512f(pauVar24[-1],*pauVar24);
        auVar48 = vunpcklpd_avx512f(auVar44,auVar46);
        auVar44 = vunpckhpd_avx512f(auVar44,auVar46);
        auVar46 = vunpcklpd_avx512f(auVar45,auVar47);
        auVar45 = vunpckhpd_avx512f(auVar45,auVar47);
        auVar47 = vshuff64x2_avx512f(auVar48,auVar44,0x88);
        auVar49 = vshuff64x2_avx512f(auVar46,auVar45,0x88);
        auVar44 = vshuff64x2_avx512f(auVar48,auVar44,0xdd);
        auVar45 = vshuff64x2_avx512f(auVar46,auVar45,0xdd);
        auVar46 = vshuff64x2_avx512f(auVar47,auVar49,0x88);
        auVar48 = vshuff64x2_avx512f(auVar44,auVar45,0x88);
        auVar47 = vshuff64x2_avx512f(auVar47,auVar49,0xdd);
        auVar44 = vshuff64x2_avx512f(auVar44,auVar45,0xdd);
        *pauVar29 = auVar46;
        pauVar29[1] = auVar48;
        pauVar29[2] = auVar47;
        pauVar29[3] = auVar44;
        pauVar29 = pauVar29 + 4;
        pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar40);
      }
    }
    if (iVar1 == 8) {
      pauVar25 = (undefined1 (*) [32])((long)B->data + local_80);
      for (iVar32 = 7; iVar32 < max_kk; iVar32 = iVar32 + 8) {
        auVar19 = vunpcklps_avx(pauVar25[-3],pauVar25[-2]);
        auVar6 = vunpckhps_avx(pauVar25[-3],pauVar25[-2]);
        auVar7 = vunpcklps_avx(pauVar25[-1],*pauVar25);
        auVar63 = vunpckhps_avx(pauVar25[-1],*pauVar25);
        auVar62 = vunpcklpd_avx(auVar19,auVar7);
        auVar19 = vunpckhpd_avx(auVar19,auVar7);
        auVar7 = vunpcklpd_avx(auVar6,auVar63);
        auVar6 = vunpckhpd_avx(auVar6,auVar63);
        auVar63._16_16_ = auVar19._0_16_;
        auVar63._0_16_ = auVar62._0_16_;
        auVar64._16_16_ = auVar6._0_16_;
        auVar64._0_16_ = auVar7._0_16_;
        auVar19 = vperm2f128_avx(auVar62,auVar19,0x31);
        auVar6 = vperm2f128_avx(auVar7,auVar6,0x31);
        *(undefined1 (*) [32])*pauVar29 = auVar63;
        *(undefined1 (*) [32])(*pauVar29 + 0x20) = auVar64;
        *(undefined1 (*) [32])pauVar29[1] = auVar19;
        *(undefined1 (*) [32])(pauVar29[1] + 0x20) = auVar6;
        pauVar29 = pauVar29 + 2;
        pauVar25 = (undefined1 (*) [32])(*pauVar25 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar26 = (undefined1 (*) [16])((long)B->data + local_88);
      for (iVar32 = 3; iVar32 < max_kk; iVar32 = iVar32 + 4) {
        auVar15 = vunpcklps_avx(pauVar26[-3],pauVar26[-2]);
        auVar4 = vunpcklps_avx(pauVar26[-1],*pauVar26);
        auVar2 = vunpckhps_avx(pauVar26[-3],pauVar26[-2]);
        auVar3 = vunpckhps_avx(pauVar26[-1],*pauVar26);
        auVar16 = vunpcklpd_avx(auVar15,auVar4);
        auVar15 = vunpckhpd_avx(auVar15,auVar4);
        auVar4 = vunpcklpd_avx(auVar2,auVar3);
        auVar2 = vunpckhpd_avx(auVar2,auVar3);
        *(undefined1 (*) [16])*pauVar29 = auVar16;
        *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar15;
        *(undefined1 (*) [16])(*pauVar29 + 0x20) = auVar4;
        *(undefined1 (*) [16])(*pauVar29 + 0x30) = auVar2;
        pauVar29 = pauVar29 + 1;
        pauVar26 = (undefined1 (*) [16])(*pauVar26 + lVar38);
      }
    }
    if (iVar1 == 1) {
      pauVar26 = (undefined1 (*) [16])((long)B->data + lVar27);
      iVar32 = iVar35;
      while (bVar41 = iVar32 != 0, iVar32 = iVar32 + -1, bVar41) {
        *(undefined1 (*) [16])*pauVar29 = *pauVar26;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
        pauVar26 = (undefined1 (*) [16])(*pauVar26 + lVar33);
      }
    }
    lVar30 = lVar30 + 0x100;
    local_c0 = local_c0 + 0x80;
    lVar39 = lVar39 + 0x40;
    lVar27 = lVar27 + 0x10;
    local_a8 = local_a8 + 0x100;
    local_b0 = local_b0 + 0x80;
    local_b8 = local_b8 + 0x40;
    local_a0 = local_a0 + 0x10;
    local_78 = local_78 + 0x100;
    local_80 = local_80 + 0x80;
    local_88 = local_88 + 0x40;
  }
  for (; (long)(uVar31 | 1) < lVar36; uVar31 = uVar31 + 2) {
    if (iVar1 == 0x10) {
      pauVar24 = (undefined1 (*) [64])((long)B->data + local_a8);
      for (iVar32 = 0xf; iVar32 < max_kk; iVar32 = iVar32 + 0x10) {
        auVar44 = vunpcklps_avx512f(pauVar24[-1],*pauVar24);
        auVar45 = vunpckhps_avx512f(pauVar24[-1],*pauVar24);
        auVar46 = vshuff64x2_avx512f(auVar44,auVar45,0x88);
        auVar44 = vshuff64x2_avx512f(auVar44,auVar45,0xdd);
        auVar45 = vshuff64x2_avx512f(auVar46,auVar44,0x88);
        auVar44 = vshuff64x2_avx512f(auVar46,auVar44,0xdd);
        *pauVar29 = auVar45;
        pauVar29[1] = auVar44;
        pauVar29 = pauVar29 + 2;
        pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar40);
      }
    }
    if (iVar1 == 8) {
      pauVar25 = (undefined1 (*) [32])((long)B->data + local_b0);
      for (iVar32 = 7; iVar32 < max_kk; iVar32 = iVar32 + 8) {
        auVar6 = vunpcklps_avx(pauVar25[-1],*pauVar25);
        auVar19 = vunpckhps_avx(pauVar25[-1],*pauVar25);
        auVar62._16_16_ = auVar19._0_16_;
        auVar62._0_16_ = auVar6._0_16_;
        auVar19 = vperm2f128_avx(auVar6,auVar19,0x31);
        *(undefined1 (*) [32])*pauVar29 = auVar62;
        *(undefined1 (*) [32])(*pauVar29 + 0x20) = auVar19;
        pauVar29 = pauVar29 + 1;
        pauVar25 = (undefined1 (*) [32])(*pauVar25 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar26 = (undefined1 (*) [16])((long)B->data + local_b8);
      for (iVar32 = 3; iVar32 < max_kk; iVar32 = iVar32 + 4) {
        auVar2 = vunpcklps_avx(pauVar26[-1],*pauVar26);
        auVar15 = vunpckhps_avx(pauVar26[-1],*pauVar26);
        *(undefined1 (*) [16])*pauVar29 = auVar2;
        *(undefined1 (*) [16])(*pauVar29 + 0x10) = auVar15;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
        pauVar26 = (undefined1 (*) [16])(*pauVar26 + lVar38);
      }
    }
    if (iVar1 == 1) {
      puVar34 = (undefined4 *)((long)B->data + local_a0);
      iVar32 = iVar35;
      while (bVar41 = iVar32 != 0, iVar32 = iVar32 + -1, bVar41) {
        *(undefined4 *)*pauVar29 = puVar34[-1];
        *(undefined4 *)(*pauVar29 + 4) = *puVar34;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 8);
        puVar34 = puVar34 + lVar22;
      }
    }
    lVar30 = lVar30 + 0x80;
    local_c0 = local_c0 + 0x40;
    lVar39 = lVar39 + 0x20;
    lVar27 = lVar27 + 8;
    local_a8 = local_a8 + 0x80;
    local_b0 = local_b0 + 0x40;
    local_b8 = local_b8 + 0x20;
    local_a0 = local_a0 + 8;
  }
  for (; (long)uVar31 < lVar36; uVar31 = uVar31 + 1) {
    if (iVar1 == 0x10) {
      pauVar24 = (undefined1 (*) [64])((long)B->data + lVar30);
      for (iVar32 = 0xf; iVar32 < max_kk; iVar32 = iVar32 + 0x10) {
        *pauVar29 = *pauVar24;
        pauVar29 = pauVar29 + 1;
        pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar40);
      }
    }
    if (iVar1 == 8) {
      pauVar25 = (undefined1 (*) [32])((long)B->data + local_c0);
      for (iVar32 = 7; iVar32 < max_kk; iVar32 = iVar32 + 8) {
        *(undefined1 (*) [32])*pauVar29 = *pauVar25;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
        pauVar25 = (undefined1 (*) [32])(*pauVar25 + lVar37);
      }
    }
    if (iVar1 == 4) {
      pauVar26 = (undefined1 (*) [16])((long)B->data + lVar39);
      for (iVar32 = 3; iVar32 < max_kk; iVar32 = iVar32 + 4) {
        *(undefined1 (*) [16])*pauVar29 = *pauVar26;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x10);
        pauVar26 = (undefined1 (*) [16])(*pauVar26 + lVar38);
      }
    }
    if (iVar1 == 1) {
      puVar34 = (undefined4 *)((long)B->data + lVar27);
      iVar32 = iVar35;
      while (bVar41 = iVar32 != 0, iVar32 = iVar32 + -1, bVar41) {
        *(undefined4 *)*pauVar29 = *puVar34;
        pauVar29 = (undefined1 (*) [64])(*pauVar29 + 4);
        puVar34 = puVar34 + lVar22;
      }
    }
    lVar30 = lVar30 + 0x40;
    local_c0 = local_c0 + 0x20;
    lVar39 = lVar39 + 0x10;
    lVar27 = lVar27 + 4;
  }
  return;
}

Assistant:

static void transpose_pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                pp += 192;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                _mm256_store_ps(pp + 8 * 8, _r8);
                _mm256_store_ps(pp + 8 * 9, _r9);
                _mm256_store_ps(pp + 8 * 10, _ra);
                _mm256_store_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                _mm_store_ps(pp + 8, _mm_loadu_ps(p0 + 8));
                pp += 12;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                pp += 8;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += B_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += B_hstep;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += B_hstep;
            }
        }
    }
}